

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O1

shared_ptr<chaiscript::dispatch::Proxy_Function_Base>
chaiscript::bootstrap::shared_ptr_unconst_clone<chaiscript::dispatch::Proxy_Function_Base>
          (shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> *p)

{
  pointer pTVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  element_type *in_RDI;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> sVar2;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> sVar3;
  
  in_RDI->_vptr_Proxy_Function_Base =
       (_func_int **)
       (p->
       super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
       )._M_ptr;
  pTVar1 = (pointer)(p->
                    super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                    )._M_refcount._M_pi;
  (in_RDI->m_types).
  super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>._M_impl.
  super__Vector_impl_data._M_start = pTVar1;
  if (pTVar1 != (pointer)0x0) {
    in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      *(int *)&pTVar1->m_bare_type_info = *(int *)&pTVar1->m_bare_type_info + 1;
      sVar2.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      sVar2.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = in_RDI;
      return (shared_ptr<chaiscript::dispatch::Proxy_Function_Base>)
             sVar2.
             super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
      ;
    }
    LOCK();
    *(int *)&pTVar1->m_bare_type_info = *(int *)&pTVar1->m_bare_type_info + 1;
    UNLOCK();
  }
  sVar3.super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = in_RDX._M_pi;
  sVar3.super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = in_RDI;
  return (shared_ptr<chaiscript::dispatch::Proxy_Function_Base>)
         sVar3.
         super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<std::remove_const_t<Type>> shared_ptr_unconst_clone(const std::shared_ptr<std::add_const_t<Type>> &p) {
    return std::const_pointer_cast<typename std::remove_const<Type>::type>(p);
  }